

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackRPMGenerator.cxx
# Opt level: O0

int __thiscall cmCPackRPMGenerator::PackageFiles(cmCPackRPMGenerator *this)

{
  cmCPackLog *this_00;
  uint uVar1;
  ostream *poVar2;
  char *msg;
  allocator local_209;
  string local_208;
  allocator local_1e1;
  string local_1e0;
  string local_1c0 [48];
  ostringstream local_190 [8];
  ostringstream cmCPackLog_msg;
  cmCPackRPMGenerator *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar2 = std::operator<<((ostream *)local_190,"Toplevel: ");
  poVar2 = std::operator<<(poVar2,(string *)&(this->super_cmCPackGenerator).toplevel);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  this_00 = (this->super_cmCPackGenerator).Logger;
  std::__cxx11::ostringstream::str();
  msg = (char *)std::__cxx11::string::c_str();
  cmCPackLog::Log(this_00,4,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CPack/cmCPackRPMGenerator.cxx"
                  ,0x189,msg);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  uVar1 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0x17])();
  if ((uVar1 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_208,"",&local_209);
    this_local._4_4_ = PackageComponentsAllInOne(this,&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::allocator<char>::~allocator((allocator<char> *)&local_209);
  }
  else if ((this->super_cmCPackGenerator).componentPackageMethod == ONE_PACKAGE) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1e0,"ALL_COMPONENTS_IN_ONE",&local_1e1);
    this_local._4_4_ = PackageComponentsAllInOne(this,&local_1e0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  }
  else {
    this_local._4_4_ =
         PackageComponents(this,(this->super_cmCPackGenerator).componentPackageMethod ==
                                ONE_PACKAGE_PER_COMPONENT);
  }
  return this_local._4_4_;
}

Assistant:

int cmCPackRPMGenerator::PackageFiles()
{
  cmCPackLogger(cmCPackLog::LOG_DEBUG, "Toplevel: " << toplevel << std::endl);

  /* Are we in the component packaging case */
  if (WantsComponentInstallation()) {
    // CASE 1 : COMPONENT ALL-IN-ONE package
    // If ALL COMPONENTS in ONE package has been requested
    // then the package file is unique and should be open here.
    if (componentPackageMethod == ONE_PACKAGE) {
      return PackageComponentsAllInOne("ALL_COMPONENTS_IN_ONE");
    }
    // CASE 2 : COMPONENT CLASSICAL package(s) (i.e. not all-in-one)
    // There will be 1 package for each component group
    // however one may require to ignore component group and
    // in this case you'll get 1 package for each component.
    return PackageComponents(componentPackageMethod ==
                             ONE_PACKAGE_PER_COMPONENT);
  }
  // CASE 3 : NON COMPONENT package.
  return PackageComponentsAllInOne("");
}